

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall
tchecker::clockbounds::df_solver_t::add_assignment
          (df_solver_t *this,loc_id_t l1,loc_id_t l2,clock_id_t x,clock_id_t y,integer_t c)

{
  pointer puVar1;
  char *pcVar2;
  char *pcVar3;
  loc_id_t m;
  ulong uVar4;
  
  if (this->_loc_number <= l1) {
    __assert_fail("l1 < _loc_number",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0x9a,
                  "void tchecker::clockbounds::df_solver_t::add_assignment(tchecker::loc_id_t, tchecker::loc_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
                 );
  }
  if (this->_loc_number <= l2) {
    __assert_fail("l2 < _loc_number",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0x9b,
                  "void tchecker::clockbounds::df_solver_t::add_assignment(tchecker::loc_id_t, tchecker::loc_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
                 );
  }
  if (this->_clock_number <= x) {
    __assert_fail("x < _clock_number",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0x9c,
                  "void tchecker::clockbounds::df_solver_t::add_assignment(tchecker::loc_id_t, tchecker::loc_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
                 );
  }
  if (y == 0x7fffffff || y < this->_clock_number) {
    if (y != 0x7fffffff) {
      pcVar2 = index(this,(char *)(ulong)l2,x);
      pcVar3 = index(this,(char *)(ulong)l1,y);
      updateL(this,(clock_id_t)pcVar2,(clock_id_t)pcVar3,LE,c);
      pcVar2 = index(this,(char *)(ulong)l2,x);
      pcVar3 = index(this,(char *)(ulong)l1,y);
      updateU(this,(clock_id_t)pcVar2,(clock_id_t)pcVar3,LE,c);
      if ((x != y) && (this->_loc_number != 0)) {
        uVar4 = 0;
        do {
          puVar1 = (this->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar1[uVar4] != puVar1[l1]) {
            pcVar2 = index(this,(char *)(uVar4 & 0xffffffff),x);
            pcVar3 = index(this,(char *)(ulong)l1,y);
            updateL(this,(clock_id_t)pcVar2,(clock_id_t)pcVar3,LE,c);
            pcVar2 = index(this,(char *)(uVar4 & 0xffffffff),x);
            pcVar3 = index(this,(char *)(ulong)l1,y);
            updateU(this,(clock_id_t)pcVar2,(clock_id_t)pcVar3,LE,c);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < this->_loc_number);
      }
    }
    return;
  }
  __assert_fail("y < _clock_number || y == tchecker::REFCLOCK_ID",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                ,0x9d,
                "void tchecker::clockbounds::df_solver_t::add_assignment(tchecker::loc_id_t, tchecker::loc_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
               );
}

Assistant:

void df_solver_t::add_assignment(tchecker::loc_id_t l1, tchecker::loc_id_t l2, tchecker::clock_id_t x, tchecker::clock_id_t y,
                                 tchecker::integer_t c)
{
  assert(l1 < _loc_number);
  assert(l2 < _loc_number);
  assert(x < _clock_number);
  assert(y < _clock_number || y == tchecker::REFCLOCK_ID);

  // If const assignment, nothing to do
  if (y == tchecker::REFCLOCK_ID)
    return;

  // Propagation over the edge: L_{l2,x} - L_{l1,y} <= c / U_{l2,x} - U_{l1,xy} <= c
  updateL(index(l2, x), index(l1, y), tchecker::LE, c);
  updateU(index(l2, x), index(l1, y), tchecker::LE, c);

  // We need to propagate shared variables only when x != y
  if (x == y)
    return;

  // Propagation across processes: L_{m,x} - L_{l1,y} <= c / U_{m,x} - U_{l1,y} <= c
  // for every location m in another process
  for (tchecker::loc_id_t m = 0; m < _loc_number; ++m)
    if (_loc_pid[m] != _loc_pid[l1]) {
      updateL(index(m, x), index(l1, y), tchecker::LE, c);
      updateU(index(m, x), index(l1, y), tchecker::LE, c);
    }
}